

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool cmSetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool appendMode;
  bool appendAsString;
  bool source_file_directory_option_enabled;
  bool source_file_target_option_enabled;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool remove;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string propertyName;
  string propertyValue;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  undefined4 local_14c;
  string local_138;
  string local_118;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  char local_d8 [8];
  char *local_d0;
  char *local_c0;
  undefined1 local_b8 [12];
  uint uStack_ac;
  _Base_ptr local_a8;
  cmExecutionStatus *local_a0;
  cmExecutionStatus *local_98;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1) < 0x21) {
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_138._M_dataplus._M_p = (pointer)local_f8._0_8_;
    if ((undefined1 *)local_f8._0_8_ == local_f8 + 0x10) {
      return false;
    }
LAB_002b9bcc:
    operator_delete(local_138._M_dataplus._M_p,local_e8._0_8_ + 1);
    return false;
  }
  iVar3 = std::__cxx11::string::compare((char *)pbVar1);
  if (iVar3 == 0) {
    local_14c = 3;
LAB_002b9d3d:
    bVar2 = false;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar3 == 0) {
      local_14c = 2;
      goto LAB_002b9d3d;
    }
    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar3 == 0) {
      local_14c = 0;
      goto LAB_002b9d3d;
    }
    iVar3 = std::__cxx11::string::compare((char *)pbVar1);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)pbVar1);
      if (iVar3 == 0) {
        local_14c = 5;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)pbVar1);
        if (iVar3 == 0) {
          local_14c = 4;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)pbVar1);
          if (iVar3 != 0) {
            local_f8._0_8_ = &DAT_00000014;
            local_f8._8_8_ = "given invalid scope ";
            unique0x00012000 = (pbVar1->_M_dataplus)._M_p;
            local_b8._0_8_ = pbVar1->_M_string_length;
            cmStrCat<char[77]>(&local_138,(cmAlphaNum *)local_f8,(cmAlphaNum *)local_b8,
                               (char (*) [77])
                               ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, CACHE, INSTALL."
                              );
            std::__cxx11::string::_M_assign((string *)&status->Error);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p == &local_138.field_2) {
              return false;
            }
            local_e8._0_8_ =
                 CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                          local_138.field_2._M_local_buf[0]);
            goto LAB_002b9bcc;
          }
          local_14c = 8;
        }
      }
      goto LAB_002b9d3d;
    }
    local_14c = 1;
    bVar2 = true;
  }
  local_a0 = (cmExecutionStatus *)(local_b8 + 8);
  stack0xffffffffffffff50 = (pointer)((ulong)uStack_ac << 0x20);
  local_a8 = (_Base_ptr)0x0;
  local_90 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start + 1;
  local_98 = local_a0;
  if (__x != pbVar1) {
    remove = true;
    iVar3 = 1;
    local_c0 = "";
    appendAsString = false;
    source_file_target_option_enabled = false;
    source_file_directory_option_enabled = false;
    appendMode = false;
    do {
      iVar4 = std::__cxx11::string::compare((char *)__x);
      if (iVar4 == 0) {
        iVar3 = 2;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)__x);
        if (iVar4 == 0) {
          remove = false;
          appendMode = true;
          iVar3 = 0;
          appendAsString = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)__x);
          if (iVar4 == 0) {
            remove = false;
            appendMode = true;
            iVar3 = 0;
            appendAsString = true;
          }
          else if (iVar3 - 4U < 0xfffffffe && bVar2) {
            iVar4 = std::__cxx11::string::compare((char *)__x);
            if (iVar4 == 0) {
              iVar3 = 4;
              source_file_directory_option_enabled = true;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)__x);
              if (iVar4 != 0) goto LAB_002b9e8a;
              iVar3 = 5;
              source_file_target_option_enabled = true;
            }
          }
          else {
LAB_002b9e8a:
            switch(iVar3) {
            case 1:
              iVar3 = 1;
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_b8,__x);
              break;
            case 2:
              iVar3 = 3;
              std::__cxx11::string::_M_assign((string *)&local_138);
              break;
            case 3:
              std::__cxx11::string::append((char *)&local_118);
              std::__cxx11::string::_M_append((char *)&local_118,(ulong)(__x->_M_dataplus)._M_p);
              iVar3 = 3;
              remove = false;
              local_c0 = ";";
              break;
            case 4:
              iVar3 = 4;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_68,__x);
              break;
            case 5:
              iVar3 = 5;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_88,__x);
              break;
            default:
              local_e8._8_8_ = (__x->_M_dataplus)._M_p;
              local_e8._0_8_ = __x->_M_string_length;
              local_f8._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x18;
              local_f8._8_8_ = "given invalid argument \"";
              local_d8[0] = '\x02';
              local_d8[1] = '\0';
              local_d8[2] = '\0';
              local_d8[3] = '\0';
              local_d8[4] = '\0';
              local_d8[5] = '\0';
              local_d8[6] = '\0';
              local_d8[7] = '\0';
              local_d0 = "\".";
              views._M_len = 3;
              views._M_array = (iterator)local_f8;
              cmCatViews_abi_cxx11_(&local_50,views);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002ba0c6;
              goto LAB_002ba0be;
            }
          }
        }
      }
      __x = __x + 1;
    } while (__x != pbVar1);
    if (local_138._M_string_length != 0) {
      local_f8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_f8._8_8_ = (pointer)0x0;
      local_e8._0_8_ = (pointer)0x0;
      bVar2 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                        (status,source_file_directory_option_enabled,
                         source_file_target_option_enabled,&local_68,&local_88,
                         (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_f8);
      if (bVar2) {
        bVar2 = true;
        switch(local_14c) {
        case 0:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleTargetMode
                            (status,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b8,&local_138,&local_118,appendAsString,appendMode,
                             remove);
          break;
        case 1:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleSourceMode
                            (status,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b8,&local_138,&local_118,appendAsString,appendMode,
                             remove,(vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)local_f8,
                             (bool)(source_file_directory_option_enabled |
                                   source_file_target_option_enabled));
          break;
        case 2:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleDirectoryMode
                            ((anon_unknown_dwarf_bf46f0 *)status,local_a0,local_90,&local_138,
                             &local_118,appendAsString,appendMode,remove);
          break;
        case 3:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleGlobalMode
                            (status,local_90,&local_138,&local_118,appendAsString,appendMode,remove)
          ;
          break;
        case 4:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleCacheMode
                            (status,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b8,&local_138,&local_118,appendAsString,appendMode,
                             remove);
          break;
        case 5:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleTestMode
                            (status,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b8,&local_138,&local_118,appendAsString,appendMode,
                             remove);
          break;
        case 8:
          bVar2 = anon_unknown.dwarf_bf46f0::HandleInstallMode
                            (status,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b8,&local_138,&local_118,appendAsString,appendMode,
                             remove);
        }
      }
      else {
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_f8._0_8_,local_e8._0_8_ - local_f8._0_8_);
      }
      goto LAB_002ba27b;
    }
  }
  local_f8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)(local_f8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,"not given a PROPERTY <name> argument.","");
  std::__cxx11::string::_M_assign((string *)&status->Error);
  local_50.field_2._M_allocated_capacity = local_e8._0_8_;
  local_50._M_dataplus._M_p = (pointer)local_f8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_f8 + 0x10)) {
LAB_002ba0be:
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_002ba0c6:
  bVar2 = false;
LAB_002ba27b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,
                    CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                             local_118.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b8);
  return bVar2;
}

Assistant:

bool cmSetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the scope on which to set the property.
  std::string const& scopeName = args.front();
  cmProperty::ScopeType scope;
  if (scopeName == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (scopeName == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (scopeName == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (scopeName == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (scopeName == "TEST") {
    scope = cmProperty::TEST;
  } else if (scopeName == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (scopeName == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat("given invalid scope ", scopeName,
                             ".  "
                             "Valid scopes are GLOBAL, DIRECTORY, "
                             "TARGET, SOURCE, TEST, CACHE, INSTALL."));
    return false;
  }

  bool appendAsString = false;
  bool appendMode = false;
  bool remove = true;
  std::set<std::string> names;
  std::string propertyName;
  std::string propertyValue;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Parse the rest of the arguments up to the values.
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingProperty,
    DoingValues,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNames;
  const char* sep = "";
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "PROPERTY") {
      doing = DoingProperty;
    } else if (arg == "APPEND") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = false;
    } else if (arg == "APPEND_STRING") {
      doing = DoingNone;
      appendMode = true;
      remove = false;
      appendAsString = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing != DoingProperty && doing != DoingValues &&
               scope == cmProperty::SOURCE_FILE && arg == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingNames) {
      names.insert(arg);
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(arg);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(arg);
    } else if (doing == DoingProperty) {
      propertyName = arg;
      doing = DoingValues;
    } else if (doing == DoingValues) {
      propertyValue += sep;
      sep = ";";
      propertyValue += arg;
      remove = false;
    } else {
      status.SetError(cmStrCat("given invalid argument \"", arg, "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;

  // Dispatch property setting.
  switch (scope) {
    case cmProperty::GLOBAL:
      return HandleGlobalMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::DIRECTORY:
      return HandleDirectoryMode(status, names, propertyName, propertyValue,
                                 appendAsString, appendMode, remove);
    case cmProperty::TARGET:
      return HandleTargetMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove);
    case cmProperty::SOURCE_FILE:
      return HandleSourceMode(status, names, propertyName, propertyValue,
                              appendAsString, appendMode, remove,
                              source_file_directory_makefiles,
                              source_file_paths_should_be_absolute);
    case cmProperty::TEST:
      return HandleTestMode(status, names, propertyName, propertyValue,
                            appendAsString, appendMode, remove);
    case cmProperty::CACHE:
      return HandleCacheMode(status, names, propertyName, propertyValue,
                             appendAsString, appendMode, remove);
    case cmProperty::INSTALL:
      return HandleInstallMode(status, names, propertyName, propertyValue,
                               appendAsString, appendMode, remove);

    case cmProperty::VARIABLE:
    case cmProperty::CACHED_VARIABLE:
      break; // should never happen
  }
  return true;
}